

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O2

void __thiscall RegionChecker::printRange(RegionChecker *this,int from,int to)

{
  const_reference cVar1;
  ostream *poVar2;
  size_type __n;
  
  __n = (size_type)from;
  do {
    if ((long)to <= (long)__n) {
      return;
    }
    cVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->fileUsage,__n);
    __n = __n + 1;
  } while (!cVar1);
  poVar2 = std::operator<<((ostream *)&std::cout,"Size: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,to - from);
  poVar2 = std::operator<<(poVar2," Start: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,from);
  poVar2 = std::operator<<(poVar2," End: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,to);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void RegionChecker::printRange(int from, int to) const {
	for (int i = from; i < to; i++) {
		if (fileUsage[i]) {
			goto nonzero;
		}
	}
	return;
nonzero:
	std::cout << "Size: " << (to - from) << " Start: " << from << " End: " << to << std::endl;
}